

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_models.c
# Opt level: O2

void s390_init_cpu_model(uc_struct *uc,uc_cpu_s390x cpu_model)

{
  CPUState *pCVar1;
  CPUClass *pCVar2;
  void *pvVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  long lVar8;
  TranslationBlock *pTVar9;
  TranslationBlock *pTVar10;
  S390CPUClass *xcc;
  tb_tc *ptVar11;
  S390CPU *cpu;
  undefined4 uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  
  for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 4) {
    ignored_base_feat[(ulong)(long)*(int *)((long)&init_ignored_base_feat_feats + lVar8) >> 6] =
         ignored_base_feat[(ulong)(long)*(int *)((long)&init_ignored_base_feat_feats + lVar8) >> 6]
         | 1L << ((byte)*(int *)((long)&init_ignored_base_feat_feats + lVar8) & 0x3f);
  }
  s390_init_feat_bitmap(qemu_max_cpu_feat_init,qemu_max_cpu_feat);
  for (lVar8 = 0; lVar8 != 0x2640; lVar8 = lVar8 + 0x110) {
    s390_init_feat_bitmap
              ((uint64_t *)((long)s390_cpu_defs[0].base_init + lVar8),
               (unsigned_long *)((long)s390_cpu_defs[0].base_feat + lVar8));
    s390_init_feat_bitmap
              ((uint64_t *)((long)s390_cpu_defs[0].default_init + lVar8),
               (unsigned_long *)((long)s390_cpu_defs[0].default_feat + lVar8));
    s390_init_feat_bitmap
              ((uint64_t *)((long)s390_cpu_defs[0].full_init + lVar8),
               (unsigned_long *)((long)s390_cpu_defs[0].full_feat + lVar8));
  }
  s390_set_qemu_cpu_model(0x2964,'\r','\x02',s390_init_cpu_model::qemu_latest_init);
  if (cpu_model < UC_CPU_S390X_QEMU) {
    pCVar1 = uc->cpu;
    pCVar2 = pCVar1->cc;
    *(undefined1 *)&pCVar2[1].has_work = 1;
    pCVar2[1].reset = (_func_void_CPUState_ptr_conflict *)(s390_cpu_defs + cpu_model);
    pTVar9 = (TranslationBlock *)g_malloc0(0x40);
    pCVar1[1].tb_jmp_cache[0x1db] = pTVar9;
    pTVar10 = pCVar1[1].tb_jmp_cache[0x1f1];
    pTVar9->pc = (target_ulong)pTVar10;
    ptVar11 = &pTVar10->tc;
    if (*(char *)(pCVar1[1].tb_jmp_cache + 0x1f2) == '\0') {
      ptVar11 = (tb_tc *)&pTVar10->jmp_list_head;
    }
    uVar12 = *(undefined4 *)&ptVar11->size;
    uVar4 = *(undefined2 *)((long)&ptVar11->size + 4);
    uVar5 = *(undefined2 *)((long)&ptVar11->size + 6);
    pTVar10 = *(TranslationBlock **)(ptVar11 + 1);
    pvVar3 = *(void **)((long)(ptVar11 + 1) + 8);
    pTVar9->cs_base = (target_ulong)ptVar11->ptr;
    pTVar9->flags = uVar12;
    pTVar9->size = uVar4;
    pTVar9->icount = uVar5;
    *(TranslationBlock **)&pTVar9->cflags = pTVar10;
    (pTVar9->tc).ptr = pvVar3;
    (pTVar9->tc).size = *(size_t *)(ptVar11 + 2);
  }
  else {
    if (cpu_model == UC_CPU_S390X_QEMU) {
      pCVar1 = uc->cpu;
      pTVar10 = (TranslationBlock *)g_malloc0(0x40);
      pCVar1[1].tb_jmp_cache[0x1db] = pTVar10;
      uVar6 = s390_qemu_cpu_model.features[0];
      pTVar10->pc = (target_ulong)s390_qemu_cpu_model.def;
      pTVar10->cs_base = uVar6;
      uVar6 = s390_qemu_cpu_model.features[2];
      uVar4 = s390_qemu_cpu_model.features[1]._4_2_;
      uVar5 = s390_qemu_cpu_model.features[1]._6_2_;
      pTVar10->flags = (undefined4)s390_qemu_cpu_model.features[1];
      uVar7 = s390_qemu_cpu_model.features[2];
      pTVar10->size = uVar4;
      pTVar10->icount = uVar5;
      s390_qemu_cpu_model.features[2]._0_4_ = (undefined4)uVar6;
      s390_qemu_cpu_model.features[2]._4_4_ = SUB84(uVar6,4);
      uVar12 = s390_qemu_cpu_model.features[2]._4_4_;
      pTVar10->cflags = (undefined4)s390_qemu_cpu_model.features[2];
      s390_qemu_cpu_model.features[2] = uVar7;
      uVar6 = s390_qemu_cpu_model.features[4];
      pTVar10->trace_vcpu_dstate = uVar12;
      (pTVar10->tc).ptr = (void *)s390_qemu_cpu_model.features[3];
      (pTVar10->tc).size = uVar6;
      uVar12 = s390_qemu_cpu_model._48_4_;
      uVar13 = s390_qemu_cpu_model.cpu_id;
      uVar14 = s390_qemu_cpu_model._56_4_;
      uVar15 = s390_qemu_cpu_model._60_4_;
    }
    else {
      if (cpu_model != UC_CPU_S390X_MAX) {
        return;
      }
      pCVar1 = uc->cpu;
      get_max_cpu_model();
      pTVar10 = (TranslationBlock *)g_malloc(0x40);
      pCVar1[1].tb_jmp_cache[0x1db] = pTVar10;
      uVar6 = get_max_cpu_model::max_model.features[0];
      pTVar10->pc = (target_ulong)get_max_cpu_model::max_model.def;
      pTVar10->cs_base = uVar6;
      uVar6 = get_max_cpu_model::max_model.features[2];
      uVar4 = get_max_cpu_model::max_model.features[1]._4_2_;
      uVar5 = get_max_cpu_model::max_model.features[1]._6_2_;
      pTVar10->flags = (undefined4)get_max_cpu_model::max_model.features[1];
      uVar7 = get_max_cpu_model::max_model.features[2];
      pTVar10->size = uVar4;
      pTVar10->icount = uVar5;
      get_max_cpu_model::max_model.features[2]._0_4_ = (undefined4)uVar6;
      get_max_cpu_model::max_model.features[2]._4_4_ = SUB84(uVar6,4);
      uVar12 = get_max_cpu_model::max_model.features[2]._4_4_;
      pTVar10->cflags = (undefined4)get_max_cpu_model::max_model.features[2];
      get_max_cpu_model::max_model.features[2] = uVar7;
      uVar6 = get_max_cpu_model::max_model.features[4];
      pTVar10->trace_vcpu_dstate = uVar12;
      (pTVar10->tc).ptr = (void *)get_max_cpu_model::max_model.features[3];
      (pTVar10->tc).size = uVar6;
      uVar12 = get_max_cpu_model::max_model._48_4_;
      uVar13 = get_max_cpu_model::max_model.cpu_id;
      uVar14 = get_max_cpu_model::max_model._56_4_;
      uVar15 = get_max_cpu_model::max_model._60_4_;
    }
    *(undefined4 *)&pTVar10->orig_tb = uVar12;
    *(uint32_t *)((long)&pTVar10->orig_tb + 4) = uVar13;
    *(undefined4 *)pTVar10->page_next = uVar14;
    *(undefined4 *)((long)pTVar10->page_next + 4) = uVar15;
  }
  return;
}

Assistant:

void s390_init_cpu_model(uc_engine *uc, uc_cpu_s390x cpu_model)
{
    static const S390FeatInit qemu_latest_init = { S390_FEAT_LIST_QEMU_LATEST };
    int i;

    init_ignored_base_feat();

    /* init all bitmaps from gnerated data initially */
    s390_init_feat_bitmap(qemu_max_cpu_feat_init, qemu_max_cpu_feat);
    for (i = 0; i < ARRAY_SIZE(s390_cpu_defs); i++) {
        s390_init_feat_bitmap(s390_cpu_defs[i].base_init,
                              s390_cpu_defs[i].base_feat);
        s390_init_feat_bitmap(s390_cpu_defs[i].default_init,
                              s390_cpu_defs[i].default_feat);
        s390_init_feat_bitmap(s390_cpu_defs[i].full_init,
                              s390_cpu_defs[i].full_feat);
    }

    /* initialize the qemu model with latest definition */
    s390_set_qemu_cpu_model(QEMU_MAX_CPU_TYPE, QEMU_MAX_CPU_GEN,
                            QEMU_MAX_CPU_EC_GA, qemu_latest_init);

    if (cpu_model < ARRAY_SIZE(s390_cpu_defs)) {
        s390_base_cpu_model_class_init(uc, uc->cpu->cc, (void *) &s390_cpu_defs[cpu_model]);
        s390_cpu_model_class_init(uc, uc->cpu->cc, (void *) &s390_cpu_defs[cpu_model]);
        s390_cpu_model_initfn(uc->cpu);
    } else if (cpu_model == UC_CPU_S390X_MAX) {
        s390_max_cpu_model_class_init(uc, uc->cpu->cc, NULL);
        s390_max_cpu_model_initfn(uc->cpu);
    } else if (cpu_model == UC_CPU_S390X_QEMU) {
        s390_qemu_cpu_model_class_init(uc, uc->cpu->cc, NULL);
        s390_qemu_cpu_model_initfn(uc->cpu);
    }

}